

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

optional<uint256> * __thiscall
node::anon_unknown_2::MinerImpl::getTipHash
          (optional<uint256> *__return_storage_ptr__,MinerImpl *this)

{
  pointer ppCVar1;
  CBlockIndex *pCVar2;
  uint256 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar8;
  Chainstate *pCVar9;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock42;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &cs_main.super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  puVar8 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x398,"chainman","m_node.chainman");
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((puVar8->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar1 = (pCVar9->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((ppCVar1 ==
       (pCVar9->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
       _M_impl.super__Vector_impl_data._M_start) ||
     (pCVar2 = ppCVar1[-1], pCVar2 == (CBlockIndex *)0x0)) {
    bVar7 = false;
  }
  else {
    puVar3 = pCVar2->phashBlock;
    if (puVar3 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    uVar4 = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
    uVar5 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
    uVar6 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
             super__Optional_payload_base<uint256>._M_payload + 0x10) =
         *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
             super__Optional_payload_base<uint256>._M_payload + 0x18) = uVar6;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
      super__Optional_payload_base<uint256>._M_payload = uVar4;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
             super__Optional_payload_base<uint256>._M_payload + 8) = uVar5;
    bVar7 = true;
  }
  (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = bVar7;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint256> getTipHash() override
    {
        LOCK(::cs_main);
        CBlockIndex* tip{chainman().ActiveChain().Tip()};
        if (!tip) return {};
        return tip->GetBlockHash();
    }